

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O0

error_code __thiscall flowtest::Parser::parse(Parser *this,Report *report)

{
  Report *pRVar1;
  bool bVar2;
  error_code eVar3;
  Message local_88;
  Report *local_28;
  Report *report_local;
  Parser *this_local;
  error_category *local_10;
  
  local_28 = report;
  report_local = (Report *)this;
  Lexer::consume(&this->lexer_,InitializerMark);
  while( true ) {
    bVar2 = Lexer::eof(&this->lexer_);
    pRVar1 = local_28;
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    parseMessage(&local_88,this);
    (*pRVar1->_vptr_Report[2])(pRVar1,&local_88);
    flow::diagnostics::Message::~Message(&local_88);
  }
  std::error_code::error_code((error_code *)&this_local);
  eVar3._4_4_ = 0;
  eVar3._M_value = (uint)this_local;
  eVar3._M_cat = local_10;
  return eVar3;
}

Assistant:

std::error_code Parser::parse(flow::diagnostics::Report* report) {
  lexer_.consume(Token::InitializerMark);

  while (!lexer_.eof())
    report->push_back(parseMessage());

  return std::error_code{};
}